

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrElse.cpp
# Opt level: O0

Scope * __thiscall
FactoredQLastTimeStepOrElse::GetAgentScopeForLQF
          (FactoredQLastTimeStepOrElse *this,Index e,Index stage)

{
  PlanningUnit *this_00;
  size_t sVar1;
  undefined8 uVar2;
  const_reference pvVar3;
  int in_EDX;
  vector<Scope,_std::allocator<Scope>_> *in_RDI;
  E *unaff_retaddr;
  Index last_stage;
  size_type in_stack_ffffffffffffffc8;
  vector<Scope,_std::allocator<Scope>_> *arg;
  
  arg = in_RDI;
  this_00 = (PlanningUnit *)
            (*(code *)(in_RDI->super__Vector_base<Scope,_std::allocator<Scope>_>)._M_impl.
                      super__Vector_impl_data._M_finish[5].super_SDT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start)
                      (&(in_RDI->super__Vector_base<Scope,_std::allocator<Scope>_>)._M_impl.
                        super__Vector_impl_data._M_finish);
  sVar1 = PlanningUnit::GetHorizon(this_00);
  if (in_EDX != (int)sVar1 + -1) {
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(unaff_retaddr,(char *)arg);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  pvVar3 = std::vector<Scope,_std::allocator<Scope>_>::at(in_RDI,in_stack_ffffffffffffffc8);
  return pvVar3;
}

Assistant:

const Scope& FactoredQLastTimeStepOrElse::GetAgentScopeForLQF(Index e,Index stage) const
{
    Index last_stage = GetPUF()->GetHorizon() - 1;
    if(stage != last_stage)
        throw E("FactoredQLastTimeStepOrElse::GetNrLQFs called for stage other than the last!");
    return _m_agentScopes.at(e);
}